

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::trivialHeuristic(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *lp)

{
  long lVar1;
  Tolerances *pTVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  Item *pIVar4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Real RVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  fpclass_type fVar10;
  cpp_dec_float<200U,_int,_void> *pcVar11;
  fpclass_type fVar12;
  long lVar13;
  long lVar14;
  fpclass_type fVar15;
  uint uVar16;
  long lVar17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar19;
  pointer pnVar20;
  uint *puVar21;
  cpp_dec_float<200U,_int,_void> *pcVar22;
  cpp_dec_float<200U,_int,_void> *pcVar23;
  pointer pnVar24;
  uint *puVar25;
  cpp_dec_float<200U,_int,_void> *pcVar26;
  int32_t iVar27;
  byte bVar28;
  long in_FS_OFFSET;
  byte bVar29;
  type t;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  downLocks;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  upLocks;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  locksol;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  uppersol;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  lowersol;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  zerosol;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lockObj;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  upperObj;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lowerObj;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  zeroObj;
  int local_ff4;
  cpp_dec_float<200U,_int,_void> local_fe8;
  long local_f60;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_f58;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_f40;
  cpp_dec_float<200U,_int,_void> local_f28;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_ea0;
  undefined8 local_e88;
  undefined8 uStack_e80;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_e70;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_e58;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_e40;
  undefined4 local_e28;
  uint uStack_e24;
  undefined4 uStack_e20;
  uint uStack_e1c;
  long local_e10;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_e08;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_df0;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_dd8;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_dc0;
  cpp_dec_float<200U,_int,_void> local_da8;
  cpp_dec_float<200U,_int,_void> local_d28;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_ca8;
  cpp_dec_float<200U,_int,_void> local_c28;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_ba8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b28;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_aa8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a28;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_9a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_928;
  cpp_dec_float<200U,_int,_void> local_8a8;
  cpp_dec_float<200U,_int,_void> local_824;
  uint local_7a4 [27];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_738;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_638;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_538;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_438;
  cpp_dec_float<200U,_int,_void> local_3b8;
  cpp_dec_float<200U,_int,_void> local_338;
  cpp_dec_float<200U,_int,_void> local_2b8;
  cpp_dec_float<200U,_int,_void> local_238;
  cpp_dec_float<200U,_int,_void> local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_138;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar29 = 0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)&local_e40,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)&local_e58,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)&local_e70,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)&local_ea0,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&local_f40,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&local_f58,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  pnVar19 = &(this->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).m_objoffset;
  pnVar18 = pnVar19;
  pcVar11 = &local_238;
  for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
    (pcVar11->data)._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
    pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar18 + (ulong)bVar29 * -8 + 4);
    pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + ((ulong)bVar29 * -2 + 1) * 4);
  }
  iVar9 = (this->
          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).m_objoffset.m_backend.exp;
  bVar7 = (this->
          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).m_objoffset.m_backend.neg;
  fVar15 = (this->
           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).m_objoffset.m_backend.fpclass;
  iVar27 = (this->
           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).m_objoffset.m_backend.prec_elem;
  pnVar18 = pnVar19;
  pcVar11 = &local_2b8;
  local_238.exp = iVar9;
  local_238.neg = bVar7;
  local_238.fpclass = fVar15;
  local_238.prec_elem = iVar27;
  for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
    (pcVar11->data)._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
    pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar18 + (ulong)bVar29 * -8 + 4);
    pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + ((ulong)bVar29 * -2 + 1) * 4);
  }
  pnVar18 = pnVar19;
  pcVar11 = &local_338;
  local_2b8.exp = iVar9;
  local_2b8.neg = bVar7;
  local_2b8.fpclass = fVar15;
  local_2b8.prec_elem = iVar27;
  for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
    (pcVar11->data)._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
    pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar18 + (ulong)bVar29 * -8 + 4);
    pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + ((ulong)bVar29 * -2 + 1) * 4);
  }
  pcVar11 = &local_3b8;
  local_338.exp = iVar9;
  local_338.neg = bVar7;
  local_338.fpclass = fVar15;
  local_338.prec_elem = iVar27;
  for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
    (pcVar11->data)._M_elems[0] = (pnVar19->m_backend).data._M_elems[0];
    pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar19 + (ulong)bVar29 * -8 + 4);
    pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + ((ulong)bVar29 * -2 + 1) * 4);
  }
  local_3b8.exp = iVar9;
  local_3b8.neg = bVar7;
  local_3b8.fpclass = fVar15;
  local_3b8.prec_elem = iVar27;
  ::soplex::infinity::__tls_init();
  local_e88 = *(double *)(in_FS_OFFSET + -8);
  local_d28.fpclass = cpp_dec_float_finite;
  local_d28.prec_elem = 0x1c;
  local_d28.data._M_elems[0] = 0;
  local_d28.data._M_elems[1] = 0;
  local_d28.data._M_elems[2] = 0;
  local_d28.data._M_elems[3] = 0;
  local_d28.data._M_elems[4] = 0;
  local_d28.data._M_elems[5] = 0;
  local_d28.data._M_elems[6] = 0;
  local_d28.data._M_elems[7] = 0;
  local_d28.data._M_elems[8] = 0;
  local_d28.data._M_elems[9] = 0;
  local_d28.data._M_elems[10] = 0;
  local_d28.data._M_elems[0xb] = 0;
  local_d28.data._M_elems[0xc] = 0;
  local_d28.data._M_elems[0xd] = 0;
  local_d28.data._M_elems[0xe] = 0;
  local_d28.data._M_elems[0xf] = 0;
  local_d28.data._M_elems[0x10] = 0;
  local_d28.data._M_elems[0x11] = 0;
  local_d28.data._M_elems[0x12] = 0;
  local_d28.data._M_elems[0x13] = 0;
  local_d28.data._M_elems[0x14] = 0;
  local_d28.data._M_elems[0x15] = 0;
  local_d28.data._M_elems[0x16] = 0;
  local_d28.data._M_elems[0x17] = 0;
  local_d28.data._M_elems[0x18] = 0;
  local_d28.data._M_elems[0x19] = 0;
  local_d28.data._M_elems._104_5_ = 0;
  local_d28.data._M_elems[0x1b]._1_3_ = 0;
  local_d28.exp = 0;
  local_d28.neg = false;
  uStack_e80 = 0;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_d28,local_e88);
  feastol((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_f28,this);
  local_8a8.fpclass = cpp_dec_float_finite;
  local_8a8.prec_elem = 0x1c;
  local_8a8.data._M_elems[0] = 0;
  local_8a8.data._M_elems[1] = 0;
  local_8a8.data._M_elems[2] = 0;
  local_8a8.data._M_elems[3] = 0;
  local_8a8.data._M_elems[4] = 0;
  local_8a8.data._M_elems[5] = 0;
  local_8a8.data._M_elems[6] = 0;
  local_8a8.data._M_elems[7] = 0;
  local_8a8.data._M_elems[8] = 0;
  local_8a8.data._M_elems[9] = 0;
  local_8a8.data._M_elems[10] = 0;
  local_8a8.data._M_elems[0xb] = 0;
  local_8a8.data._M_elems[0xc] = 0;
  local_8a8.data._M_elems[0xd] = 0;
  local_8a8.data._M_elems[0xe] = 0;
  local_8a8.data._M_elems[0xf] = 0;
  local_8a8.data._M_elems[0x10] = 0;
  local_8a8.data._M_elems[0x11] = 0;
  local_8a8.data._M_elems[0x12] = 0;
  local_8a8.data._M_elems[0x13] = 0;
  local_8a8.data._M_elems[0x14] = 0;
  local_8a8.data._M_elems[0x15] = 0;
  local_8a8.data._M_elems[0x16] = 0;
  local_8a8.data._M_elems[0x17] = 0;
  local_8a8.data._M_elems[0x18] = 0;
  local_8a8.data._M_elems[0x19] = 0;
  local_8a8.data._M_elems._104_5_ = 0;
  local_8a8.data._M_elems[0x1b]._1_3_ = 0;
  local_8a8.exp = 0;
  local_8a8.neg = false;
  local_fe8.fpclass = cpp_dec_float_finite;
  local_fe8.prec_elem = 0x1c;
  local_fe8.data._M_elems[0] = 0;
  local_fe8.data._M_elems[1] = 0;
  local_fe8.data._M_elems[2] = 0;
  local_fe8.data._M_elems[3] = 0;
  local_fe8.data._M_elems[4] = 0;
  local_fe8.data._M_elems[5] = 0;
  local_fe8.data._M_elems[6] = 0;
  local_fe8.data._M_elems[7] = 0;
  local_fe8.data._M_elems[8] = 0;
  local_fe8.data._M_elems[9] = 0;
  local_fe8.data._M_elems[10] = 0;
  local_fe8.data._M_elems[0xb] = 0;
  local_fe8.data._M_elems[0xc] = 0;
  local_fe8.data._M_elems[0xd] = 0;
  local_fe8.data._M_elems[0xe] = 0;
  local_fe8.data._M_elems[0xf] = 0;
  local_fe8.data._M_elems[0x10] = 0;
  local_fe8.data._M_elems[0x11] = 0;
  local_fe8.data._M_elems[0x12] = 0;
  local_fe8.data._M_elems[0x13] = 0;
  local_fe8.data._M_elems[0x14] = 0;
  local_fe8.data._M_elems[0x15] = 0;
  local_fe8.data._M_elems[0x16] = 0;
  local_fe8.data._M_elems[0x17] = 0;
  local_fe8.data._M_elems[0x18] = 0;
  local_fe8.data._M_elems[0x19] = 0;
  local_fe8.data._M_elems._104_5_ = 0;
  local_fe8.data._M_elems[0x1b]._1_3_ = 0;
  local_fe8.exp = 0;
  local_fe8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_fe8,1.0);
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&local_8a8,&local_fe8,&local_f28);
  ::soplex::infinity::__tls_init();
  local_138.m_backend.fpclass = cpp_dec_float_finite;
  local_138.m_backend.prec_elem = 0x1c;
  local_138.m_backend.data._M_elems[0] = 0;
  local_138.m_backend.data._M_elems[1] = 0;
  local_138.m_backend.data._M_elems[2] = 0;
  local_138.m_backend.data._M_elems[3] = 0;
  local_138.m_backend.data._M_elems[4] = 0;
  local_138.m_backend.data._M_elems[5] = 0;
  local_138.m_backend.data._M_elems[6] = 0;
  local_138.m_backend.data._M_elems[7] = 0;
  local_138.m_backend.data._M_elems[8] = 0;
  local_138.m_backend.data._M_elems[9] = 0;
  local_138.m_backend.data._M_elems[10] = 0;
  local_138.m_backend.data._M_elems[0xb] = 0;
  local_138.m_backend.data._M_elems[0xc] = 0;
  local_138.m_backend.data._M_elems[0xd] = 0;
  local_138.m_backend.data._M_elems[0xe] = 0;
  local_138.m_backend.data._M_elems[0xf] = 0;
  local_138.m_backend.data._M_elems[0x10] = 0;
  local_138.m_backend.data._M_elems[0x11] = 0;
  local_138.m_backend.data._M_elems[0x12] = 0;
  local_138.m_backend.data._M_elems[0x13] = 0;
  local_138.m_backend.data._M_elems[0x14] = 0;
  local_138.m_backend.data._M_elems[0x15] = 0;
  local_138.m_backend.data._M_elems[0x16] = 0;
  local_138.m_backend.data._M_elems[0x17] = 0;
  local_138.m_backend.data._M_elems[0x18] = 0;
  local_138.m_backend.data._M_elems[0x19] = 0;
  local_138.m_backend.data._M_elems._104_5_ = 0;
  local_138.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  local_138.m_backend.exp = 0;
  local_138.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_138,local_e88);
  pTVar2 = (this->
           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (this->
           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  RVar6 = Tolerances::epsilon(pTVar2);
  bVar7 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_8a8,&local_138,RVar6);
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  if (bVar7) {
    feastol((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)&local_da8,this);
    local_f28.fpclass = cpp_dec_float_finite;
    local_f28.prec_elem = 0x1c;
    local_f28.data._M_elems[0] = 0;
    local_f28.data._M_elems[1] = 0;
    local_f28.data._M_elems[2] = 0;
    local_f28.data._M_elems[3] = 0;
    local_f28.data._M_elems[4] = 0;
    local_f28.data._M_elems[5] = 0;
    local_f28.data._M_elems[6] = 0;
    local_f28.data._M_elems[7] = 0;
    local_f28.data._M_elems[8] = 0;
    local_f28.data._M_elems[9] = 0;
    local_f28.data._M_elems[10] = 0;
    local_f28.data._M_elems[0xb] = 0;
    local_f28.data._M_elems[0xc] = 0;
    local_f28.data._M_elems[0xd] = 0;
    local_f28.data._M_elems[0xe] = 0;
    local_f28.data._M_elems[0xf] = 0;
    local_f28.data._M_elems[0x10] = 0;
    local_f28.data._M_elems[0x11] = 0;
    local_f28.data._M_elems[0x12] = 0;
    local_f28.data._M_elems[0x13] = 0;
    local_f28.data._M_elems[0x14] = 0;
    local_f28.data._M_elems[0x15] = 0;
    local_f28.data._M_elems[0x16] = 0;
    local_f28.data._M_elems[0x17] = 0;
    local_f28.data._M_elems[0x18] = 0;
    local_f28.data._M_elems[0x19] = 0;
    local_f28.data._M_elems._104_5_ = 0;
    local_f28.data._M_elems[0x1b]._1_3_ = 0;
    local_f28.exp = 0;
    local_f28.neg = false;
    local_fe8.fpclass = cpp_dec_float_finite;
    local_fe8.prec_elem = 0x1c;
    local_fe8.data._M_elems[0] = 0;
    local_fe8.data._M_elems[1] = 0;
    local_fe8.data._M_elems[2] = 0;
    local_fe8.data._M_elems[3] = 0;
    local_fe8.data._M_elems[4] = 0;
    local_fe8.data._M_elems[5] = 0;
    local_fe8.data._M_elems[6] = 0;
    local_fe8.data._M_elems[7] = 0;
    local_fe8.data._M_elems[8] = 0;
    local_fe8.data._M_elems[9] = 0;
    local_fe8.data._M_elems[10] = 0;
    local_fe8.data._M_elems[0xb] = 0;
    local_fe8.data._M_elems[0xc] = 0;
    local_fe8.data._M_elems[0xd] = 0;
    local_fe8.data._M_elems[0xe] = 0;
    local_fe8.data._M_elems[0xf] = 0;
    local_fe8.data._M_elems[0x10] = 0;
    local_fe8.data._M_elems[0x11] = 0;
    local_fe8.data._M_elems[0x12] = 0;
    local_fe8.data._M_elems[0x13] = 0;
    local_fe8.data._M_elems[0x14] = 0;
    local_fe8.data._M_elems[0x15] = 0;
    local_fe8.data._M_elems[0x16] = 0;
    local_fe8.data._M_elems[0x17] = 0;
    local_fe8.data._M_elems[0x18] = 0;
    local_fe8.data._M_elems[0x19] = 0;
    local_fe8.data._M_elems._104_5_ = 0;
    local_fe8.data._M_elems[0x1b]._1_3_ = 0;
    local_fe8.exp = 0;
    local_fe8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_fe8,1.0);
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&local_f28,&local_fe8,&local_da8);
    pcVar11 = &local_f28;
    pcVar22 = &local_d28;
    for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
      (pcVar22->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
      pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar29 * -8 + 4);
      pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar29 * -8 + 4);
    }
    local_d28.exp = local_f28.exp;
    local_d28.neg = local_f28.neg;
    local_d28.fpclass = local_f28.fpclass;
    local_d28.prec_elem = local_f28.prec_elem;
  }
  lVar13 = (long)(lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
  if (lVar13 < 1) {
    bVar7 = true;
  }
  else {
    uStack_e24 = local_e88._4_4_ ^ 0x80000000;
    uStack_e1c = uStack_e80._4_4_ ^ 0x80000000;
    local_e28 = (undefined4)local_e88;
    uStack_e20 = (undefined4)uStack_e80;
    bVar7 = true;
    do {
      lVar1 = lVar13 + -1;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (&local_f40.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend,0);
      local_f60 = lVar13;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (&local_f58.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend,0);
      pIVar4 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.theitem;
      local_e10 = lVar1;
      iVar9 = (lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thekey[lVar1].idx;
      if (0 < pIVar4[iVar9].data.
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused) {
        pIVar4 = pIVar4 + iVar9;
        lVar17 = 0;
        lVar13 = 0;
        do {
          pNVar5 = (pIVar4->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          puVar21 = (uint *)((long)&(pNVar5->val).m_backend.data + lVar17);
          pcVar11 = &local_f28;
          for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
            (pcVar11->data)._M_elems[0] = *puVar21;
            puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
            pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar29 * -8 + 4);
          }
          local_f28.exp = *(int *)((long)&(pNVar5->val).m_backend.data + lVar17 + 0x70);
          local_f28.neg = *(bool *)((long)&(pNVar5->val).m_backend.data + lVar17 + 0x74);
          local_f28._120_8_ = *(undefined8 *)((long)&(pNVar5->val).m_backend.data + lVar17 + 0x78);
          iVar9 = *(int *)((long)(&((pIVar4->data).
                                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   .m_elem)->val + 1) + lVar17);
          pnVar24 = (lp->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).left.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pnVar20 = pnVar24 + iVar9;
          pnVar19 = &local_438;
          for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
            (pnVar19->m_backend).data._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
            pnVar20 = (pointer)((long)pnVar20 + ((ulong)bVar29 * -2 + 1) * 4);
            pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar19 + ((ulong)bVar29 * -2 + 1) * 4);
          }
          local_438.m_backend.exp = pnVar24[iVar9].m_backend.exp;
          local_438.m_backend.neg = pnVar24[iVar9].m_backend.neg;
          local_438.m_backend.fpclass = pnVar24[iVar9].m_backend.fpclass;
          local_438.m_backend.prec_elem = pnVar24[iVar9].m_backend.prec_elem;
          ::soplex::infinity::__tls_init();
          local_928.m_backend.fpclass = cpp_dec_float_finite;
          local_928.m_backend.prec_elem = 0x1c;
          local_928.m_backend.data._M_elems[0] = 0;
          local_928.m_backend.data._M_elems[1] = 0;
          local_928.m_backend.data._M_elems[2] = 0;
          local_928.m_backend.data._M_elems[3] = 0;
          local_928.m_backend.data._M_elems[4] = 0;
          local_928.m_backend.data._M_elems[5] = 0;
          local_928.m_backend.data._M_elems[6] = 0;
          local_928.m_backend.data._M_elems[7] = 0;
          local_928.m_backend.data._M_elems[8] = 0;
          local_928.m_backend.data._M_elems[9] = 0;
          local_928.m_backend.data._M_elems[10] = 0;
          local_928.m_backend.data._M_elems[0xb] = 0;
          local_928.m_backend.data._M_elems[0xc] = 0;
          local_928.m_backend.data._M_elems[0xd] = 0;
          local_928.m_backend.data._M_elems[0xe] = 0;
          local_928.m_backend.data._M_elems[0xf] = 0;
          local_928.m_backend.data._M_elems[0x10] = 0;
          local_928.m_backend.data._M_elems[0x11] = 0;
          local_928.m_backend.data._M_elems[0x12] = 0;
          local_928.m_backend.data._M_elems[0x13] = 0;
          local_928.m_backend.data._M_elems[0x14] = 0;
          local_928.m_backend.data._M_elems[0x15] = 0;
          local_928.m_backend.data._M_elems[0x16] = 0;
          local_928.m_backend.data._M_elems[0x17] = 0;
          local_928.m_backend.data._M_elems[0x18] = 0;
          local_928.m_backend.data._M_elems[0x19] = 0;
          local_928.m_backend.data._M_elems._104_5_ = 0;
          local_928.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          local_928.m_backend.exp = 0;
          local_928.m_backend.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_928,
                     (double)CONCAT44(uStack_e24,local_e28));
          pTVar2 = (this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          p_Var3 = (this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            }
          }
          RVar6 = Tolerances::epsilon(pTVar2);
          bVar8 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                            (&local_438,&local_928,RVar6);
          if (bVar8) {
            iVar9 = *(int *)((long)(&((pIVar4->data).
                                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     .m_elem)->val + 1) + lVar17);
            pnVar24 = (lp->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).right.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pnVar20 = pnVar24 + iVar9;
            pnVar19 = &local_4b8;
            for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
              (pnVar19->m_backend).data._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
              pnVar20 = (pointer)((long)pnVar20 + ((ulong)bVar29 * -2 + 1) * 4);
              pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar19 + ((ulong)bVar29 * -2 + 1) * 4);
            }
            local_4b8.m_backend.exp = pnVar24[iVar9].m_backend.exp;
            local_4b8.m_backend.neg = pnVar24[iVar9].m_backend.neg;
            local_4b8.m_backend.fpclass = pnVar24[iVar9].m_backend.fpclass;
            local_4b8.m_backend.prec_elem = pnVar24[iVar9].m_backend.prec_elem;
            ::soplex::infinity::__tls_init();
            local_9a8.m_backend.fpclass = cpp_dec_float_finite;
            local_9a8.m_backend.prec_elem = 0x1c;
            local_9a8.m_backend.data._M_elems[0] = 0;
            local_9a8.m_backend.data._M_elems[1] = 0;
            local_9a8.m_backend.data._M_elems[2] = 0;
            local_9a8.m_backend.data._M_elems[3] = 0;
            local_9a8.m_backend.data._M_elems[4] = 0;
            local_9a8.m_backend.data._M_elems[5] = 0;
            local_9a8.m_backend.data._M_elems[6] = 0;
            local_9a8.m_backend.data._M_elems[7] = 0;
            local_9a8.m_backend.data._M_elems[8] = 0;
            local_9a8.m_backend.data._M_elems[9] = 0;
            local_9a8.m_backend.data._M_elems[10] = 0;
            local_9a8.m_backend.data._M_elems[0xb] = 0;
            local_9a8.m_backend.data._M_elems[0xc] = 0;
            local_9a8.m_backend.data._M_elems[0xd] = 0;
            local_9a8.m_backend.data._M_elems[0xe] = 0;
            local_9a8.m_backend.data._M_elems[0xf] = 0;
            local_9a8.m_backend.data._M_elems[0x10] = 0;
            local_9a8.m_backend.data._M_elems[0x11] = 0;
            local_9a8.m_backend.data._M_elems[0x12] = 0;
            local_9a8.m_backend.data._M_elems[0x13] = 0;
            local_9a8.m_backend.data._M_elems[0x14] = 0;
            local_9a8.m_backend.data._M_elems[0x15] = 0;
            local_9a8.m_backend.data._M_elems[0x16] = 0;
            local_9a8.m_backend.data._M_elems[0x17] = 0;
            local_9a8.m_backend.data._M_elems[0x18] = 0;
            local_9a8.m_backend.data._M_elems[0x19] = 0;
            local_9a8.m_backend.data._M_elems._104_5_ = 0;
            local_9a8.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            local_9a8.m_backend.exp = 0;
            local_9a8.m_backend.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_9a8,local_e88);
            pTVar2 = (this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            this_00 = (this->
                      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      )._tolerances.
                      super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                      ._M_pi;
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                this_00->_M_use_count = this_00->_M_use_count + 1;
                UNLOCK();
              }
              else {
                this_00->_M_use_count = this_00->_M_use_count + 1;
              }
            }
            RVar6 = Tolerances::epsilon(pTVar2);
            bVar8 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                              (&local_4b8,&local_9a8,RVar6);
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            }
          }
          else {
            bVar8 = false;
          }
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          }
          pnVar24 = local_f40.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (bVar8 == false) {
            iVar9 = *(int *)((long)(&((pIVar4->data).
                                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     .m_elem)->val + 1) + lVar17);
            pnVar24 = (lp->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).left.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pnVar20 = pnVar24 + iVar9;
            pnVar19 = &local_538;
            for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
              (pnVar19->m_backend).data._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
              pnVar20 = (pointer)((long)pnVar20 + ((ulong)bVar29 * -2 + 1) * 4);
              pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar19 + ((ulong)bVar29 * -2 + 1) * 4);
            }
            local_538.m_backend.exp = pnVar24[iVar9].m_backend.exp;
            local_538.m_backend.neg = pnVar24[iVar9].m_backend.neg;
            local_538.m_backend.fpclass = pnVar24[iVar9].m_backend.fpclass;
            local_538.m_backend.prec_elem = pnVar24[iVar9].m_backend.prec_elem;
            ::soplex::infinity::__tls_init();
            local_a28.m_backend.fpclass = cpp_dec_float_finite;
            local_a28.m_backend.prec_elem = 0x1c;
            local_a28.m_backend.data._M_elems[0] = 0;
            local_a28.m_backend.data._M_elems[1] = 0;
            local_a28.m_backend.data._M_elems[2] = 0;
            local_a28.m_backend.data._M_elems[3] = 0;
            local_a28.m_backend.data._M_elems[4] = 0;
            local_a28.m_backend.data._M_elems[5] = 0;
            local_a28.m_backend.data._M_elems[6] = 0;
            local_a28.m_backend.data._M_elems[7] = 0;
            local_a28.m_backend.data._M_elems[8] = 0;
            local_a28.m_backend.data._M_elems[9] = 0;
            local_a28.m_backend.data._M_elems[10] = 0;
            local_a28.m_backend.data._M_elems[0xb] = 0;
            local_a28.m_backend.data._M_elems[0xc] = 0;
            local_a28.m_backend.data._M_elems[0xd] = 0;
            local_a28.m_backend.data._M_elems[0xe] = 0;
            local_a28.m_backend.data._M_elems[0xf] = 0;
            local_a28.m_backend.data._M_elems[0x10] = 0;
            local_a28.m_backend.data._M_elems[0x11] = 0;
            local_a28.m_backend.data._M_elems[0x12] = 0;
            local_a28.m_backend.data._M_elems[0x13] = 0;
            local_a28.m_backend.data._M_elems[0x14] = 0;
            local_a28.m_backend.data._M_elems[0x15] = 0;
            local_a28.m_backend.data._M_elems[0x16] = 0;
            local_a28.m_backend.data._M_elems[0x17] = 0;
            local_a28.m_backend.data._M_elems[0x18] = 0;
            local_a28.m_backend.data._M_elems[0x19] = 0;
            local_a28.m_backend.data._M_elems._104_5_ = 0;
            local_a28.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            local_a28.m_backend.exp = 0;
            local_a28.m_backend.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_a28,
                       (double)CONCAT44(uStack_e24,local_e28));
            pTVar2 = (this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            p_Var3 = (this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
            if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
              }
            }
            RVar6 = Tolerances::epsilon(pTVar2);
            bVar8 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                              (&local_538,&local_a28,RVar6);
            if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
            }
            if (bVar8) {
              if (local_f28.fpclass != cpp_dec_float_NaN) {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<long_long>(&local_fe8,0,(type *)0x0);
                iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  (&local_f28,&local_fe8);
                pnVar24 = local_f58.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (iVar9 < 1) {
                  if (local_f28.fpclass != cpp_dec_float_NaN) {
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                    cpp_dec_float<long_long>(&local_fe8,0,(type *)0x0);
                    iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                      (&local_f28,&local_fe8);
                    pnVar24 = local_f40.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    if (iVar9 < 0) {
                      local_fe8.fpclass = cpp_dec_float_finite;
                      local_fe8.prec_elem = 0x1c;
                      local_fe8.data._M_elems[0] = 0;
                      local_fe8.data._M_elems[1] = 0;
                      local_fe8.data._M_elems[2] = 0;
                      local_fe8.data._M_elems[3] = 0;
                      local_fe8.data._M_elems[4] = 0;
                      local_fe8.data._M_elems[5] = 0;
                      local_fe8.data._M_elems[6] = 0;
                      local_fe8.data._M_elems[7] = 0;
                      local_fe8.data._M_elems[8] = 0;
                      local_fe8.data._M_elems[9] = 0;
                      local_fe8.data._M_elems[10] = 0;
                      local_fe8.data._M_elems[0xb] = 0;
                      local_fe8.data._M_elems[0xc] = 0;
                      local_fe8.data._M_elems[0xd] = 0;
                      local_fe8.data._M_elems[0xe] = 0;
                      local_fe8.data._M_elems[0xf] = 0;
                      local_fe8.data._M_elems[0x10] = 0;
                      local_fe8.data._M_elems[0x11] = 0;
                      local_fe8.data._M_elems[0x12] = 0;
                      local_fe8.data._M_elems[0x13] = 0;
                      local_fe8.data._M_elems[0x14] = 0;
                      local_fe8.data._M_elems[0x15] = 0;
                      local_fe8.data._M_elems[0x16] = 0;
                      local_fe8.data._M_elems[0x17] = 0;
                      local_fe8.data._M_elems[0x18] = 0;
                      local_fe8.data._M_elems[0x19] = 0;
                      local_fe8.data._M_elems._104_5_ = 0;
                      local_fe8.data._M_elems[0x1b]._1_3_ = 0;
                      local_fe8.exp = 0;
                      local_fe8.neg = false;
                      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                      from_unsigned_long_long(&local_fe8,1);
                      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                                (&pnVar24[lVar1].m_backend,&local_fe8);
                    }
                  }
                }
                else {
                  local_fe8.fpclass = cpp_dec_float_finite;
                  local_fe8.prec_elem = 0x1c;
                  local_fe8.data._M_elems[0] = 0;
                  local_fe8.data._M_elems[1] = 0;
                  local_fe8.data._M_elems[2] = 0;
                  local_fe8.data._M_elems[3] = 0;
                  local_fe8.data._M_elems[4] = 0;
                  local_fe8.data._M_elems[5] = 0;
                  local_fe8.data._M_elems[6] = 0;
                  local_fe8.data._M_elems[7] = 0;
                  local_fe8.data._M_elems[8] = 0;
                  local_fe8.data._M_elems[9] = 0;
                  local_fe8.data._M_elems[10] = 0;
                  local_fe8.data._M_elems[0xb] = 0;
                  local_fe8.data._M_elems[0xc] = 0;
                  local_fe8.data._M_elems[0xd] = 0;
                  local_fe8.data._M_elems[0xe] = 0;
                  local_fe8.data._M_elems[0xf] = 0;
                  local_fe8.data._M_elems[0x10] = 0;
                  local_fe8.data._M_elems[0x11] = 0;
                  local_fe8.data._M_elems[0x12] = 0;
                  local_fe8.data._M_elems[0x13] = 0;
                  local_fe8.data._M_elems[0x14] = 0;
                  local_fe8.data._M_elems[0x15] = 0;
                  local_fe8.data._M_elems[0x16] = 0;
                  local_fe8.data._M_elems[0x17] = 0;
                  local_fe8.data._M_elems[0x18] = 0;
                  local_fe8.data._M_elems[0x19] = 0;
                  local_fe8.data._M_elems._104_5_ = 0;
                  local_fe8.data._M_elems[0x1b]._1_3_ = 0;
                  local_fe8.exp = 0;
                  local_fe8.neg = false;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                  from_unsigned_long_long(&local_fe8,1);
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                            (&pnVar24[lVar1].m_backend,&local_fe8);
                }
              }
            }
            else {
              iVar9 = *(int *)((long)(&((pIVar4->data).
                                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       .m_elem)->val + 1) + lVar17);
              pnVar24 = (lp->
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).right.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pnVar20 = pnVar24 + iVar9;
              pnVar19 = &local_5b8;
              for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                (pnVar19->m_backend).data._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
                pnVar20 = (pointer)((long)pnVar20 + ((ulong)bVar29 * -2 + 1) * 4);
                pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar19 + ((ulong)bVar29 * -2 + 1) * 4);
              }
              local_5b8.m_backend.exp = pnVar24[iVar9].m_backend.exp;
              local_5b8.m_backend.neg = pnVar24[iVar9].m_backend.neg;
              local_5b8.m_backend.fpclass = pnVar24[iVar9].m_backend.fpclass;
              local_5b8.m_backend.prec_elem = pnVar24[iVar9].m_backend.prec_elem;
              ::soplex::infinity::__tls_init();
              local_aa8.m_backend.fpclass = cpp_dec_float_finite;
              local_aa8.m_backend.prec_elem = 0x1c;
              local_aa8.m_backend.data._M_elems[0] = 0;
              local_aa8.m_backend.data._M_elems[1] = 0;
              local_aa8.m_backend.data._M_elems[2] = 0;
              local_aa8.m_backend.data._M_elems[3] = 0;
              local_aa8.m_backend.data._M_elems[4] = 0;
              local_aa8.m_backend.data._M_elems[5] = 0;
              local_aa8.m_backend.data._M_elems[6] = 0;
              local_aa8.m_backend.data._M_elems[7] = 0;
              local_aa8.m_backend.data._M_elems[8] = 0;
              local_aa8.m_backend.data._M_elems[9] = 0;
              local_aa8.m_backend.data._M_elems[10] = 0;
              local_aa8.m_backend.data._M_elems[0xb] = 0;
              local_aa8.m_backend.data._M_elems[0xc] = 0;
              local_aa8.m_backend.data._M_elems[0xd] = 0;
              local_aa8.m_backend.data._M_elems[0xe] = 0;
              local_aa8.m_backend.data._M_elems[0xf] = 0;
              local_aa8.m_backend.data._M_elems[0x10] = 0;
              local_aa8.m_backend.data._M_elems[0x11] = 0;
              local_aa8.m_backend.data._M_elems[0x12] = 0;
              local_aa8.m_backend.data._M_elems[0x13] = 0;
              local_aa8.m_backend.data._M_elems[0x14] = 0;
              local_aa8.m_backend.data._M_elems[0x15] = 0;
              local_aa8.m_backend.data._M_elems[0x16] = 0;
              local_aa8.m_backend.data._M_elems[0x17] = 0;
              local_aa8.m_backend.data._M_elems[0x18] = 0;
              local_aa8.m_backend.data._M_elems[0x19] = 0;
              local_aa8.m_backend.data._M_elems._104_5_ = 0;
              local_aa8.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              local_aa8.m_backend.exp = 0;
              local_aa8.m_backend.neg = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)&local_aa8,local_e88);
              pTVar2 = (this->
                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       )._tolerances.
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              p_Var3 = (this->
                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       )._tolerances.
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
              if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
                }
              }
              RVar6 = Tolerances::epsilon(pTVar2);
              bVar8 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                                (&local_5b8,&local_aa8,RVar6);
              if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
              }
              if (bVar8 && local_f28.fpclass != cpp_dec_float_NaN) {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<long_long>(&local_fe8,0,(type *)0x0);
                iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  (&local_f28,&local_fe8);
                pnVar24 = local_f40.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (iVar9 < 1) {
                  if (local_f28.fpclass != cpp_dec_float_NaN) {
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                    cpp_dec_float<long_long>(&local_fe8,0,(type *)0x0);
                    iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                      (&local_f28,&local_fe8);
                    pnVar24 = local_f58.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    if (iVar9 < 0) {
                      local_fe8.fpclass = cpp_dec_float_finite;
                      local_fe8.prec_elem = 0x1c;
                      local_fe8.data._M_elems[0] = 0;
                      local_fe8.data._M_elems[1] = 0;
                      local_fe8.data._M_elems[2] = 0;
                      local_fe8.data._M_elems[3] = 0;
                      local_fe8.data._M_elems[4] = 0;
                      local_fe8.data._M_elems[5] = 0;
                      local_fe8.data._M_elems[6] = 0;
                      local_fe8.data._M_elems[7] = 0;
                      local_fe8.data._M_elems[8] = 0;
                      local_fe8.data._M_elems[9] = 0;
                      local_fe8.data._M_elems[10] = 0;
                      local_fe8.data._M_elems[0xb] = 0;
                      local_fe8.data._M_elems[0xc] = 0;
                      local_fe8.data._M_elems[0xd] = 0;
                      local_fe8.data._M_elems[0xe] = 0;
                      local_fe8.data._M_elems[0xf] = 0;
                      local_fe8.data._M_elems[0x10] = 0;
                      local_fe8.data._M_elems[0x11] = 0;
                      local_fe8.data._M_elems[0x12] = 0;
                      local_fe8.data._M_elems[0x13] = 0;
                      local_fe8.data._M_elems[0x14] = 0;
                      local_fe8.data._M_elems[0x15] = 0;
                      local_fe8.data._M_elems[0x16] = 0;
                      local_fe8.data._M_elems[0x17] = 0;
                      local_fe8.data._M_elems[0x18] = 0;
                      local_fe8.data._M_elems[0x19] = 0;
                      local_fe8.data._M_elems._104_5_ = 0;
                      local_fe8.data._M_elems[0x1b]._1_3_ = 0;
                      local_fe8.exp = 0;
                      local_fe8.neg = false;
                      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                      from_unsigned_long_long(&local_fe8,1);
                      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                                (&pnVar24[lVar1].m_backend,&local_fe8);
                    }
                  }
                }
                else {
                  local_fe8.fpclass = cpp_dec_float_finite;
                  local_fe8.prec_elem = 0x1c;
                  local_fe8.data._M_elems[0] = 0;
                  local_fe8.data._M_elems[1] = 0;
                  local_fe8.data._M_elems[2] = 0;
                  local_fe8.data._M_elems[3] = 0;
                  local_fe8.data._M_elems[4] = 0;
                  local_fe8.data._M_elems[5] = 0;
                  local_fe8.data._M_elems[6] = 0;
                  local_fe8.data._M_elems[7] = 0;
                  local_fe8.data._M_elems[8] = 0;
                  local_fe8.data._M_elems[9] = 0;
                  local_fe8.data._M_elems[10] = 0;
                  local_fe8.data._M_elems[0xb] = 0;
                  local_fe8.data._M_elems[0xc] = 0;
                  local_fe8.data._M_elems[0xd] = 0;
                  local_fe8.data._M_elems[0xe] = 0;
                  local_fe8.data._M_elems[0xf] = 0;
                  local_fe8.data._M_elems[0x10] = 0;
                  local_fe8.data._M_elems[0x11] = 0;
                  local_fe8.data._M_elems[0x12] = 0;
                  local_fe8.data._M_elems[0x13] = 0;
                  local_fe8.data._M_elems[0x14] = 0;
                  local_fe8.data._M_elems[0x15] = 0;
                  local_fe8.data._M_elems[0x16] = 0;
                  local_fe8.data._M_elems[0x17] = 0;
                  local_fe8.data._M_elems[0x18] = 0;
                  local_fe8.data._M_elems[0x19] = 0;
                  local_fe8.data._M_elems._104_5_ = 0;
                  local_fe8.data._M_elems[0x1b]._1_3_ = 0;
                  local_fe8.exp = 0;
                  local_fe8.neg = false;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                  from_unsigned_long_long(&local_fe8,1);
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                            (&pnVar24[lVar1].m_backend,&local_fe8);
                }
              }
            }
          }
          else {
            local_fe8.fpclass = cpp_dec_float_finite;
            local_fe8.prec_elem = 0x1c;
            local_fe8.data._M_elems[0] = 0;
            local_fe8.data._M_elems[1] = 0;
            local_fe8.data._M_elems[2] = 0;
            local_fe8.data._M_elems[3] = 0;
            local_fe8.data._M_elems[4] = 0;
            local_fe8.data._M_elems[5] = 0;
            local_fe8.data._M_elems[6] = 0;
            local_fe8.data._M_elems[7] = 0;
            local_fe8.data._M_elems[8] = 0;
            local_fe8.data._M_elems[9] = 0;
            local_fe8.data._M_elems[10] = 0;
            local_fe8.data._M_elems[0xb] = 0;
            local_fe8.data._M_elems[0xc] = 0;
            local_fe8.data._M_elems[0xd] = 0;
            local_fe8.data._M_elems[0xe] = 0;
            local_fe8.data._M_elems[0xf] = 0;
            local_fe8.data._M_elems[0x10] = 0;
            local_fe8.data._M_elems[0x11] = 0;
            local_fe8.data._M_elems[0x12] = 0;
            local_fe8.data._M_elems[0x13] = 0;
            local_fe8.data._M_elems[0x14] = 0;
            local_fe8.data._M_elems[0x15] = 0;
            local_fe8.data._M_elems[0x16] = 0;
            local_fe8.data._M_elems[0x17] = 0;
            local_fe8.data._M_elems[0x18] = 0;
            local_fe8.data._M_elems[0x19] = 0;
            local_fe8.data._M_elems._104_5_ = 0;
            local_fe8.data._M_elems[0x1b]._1_3_ = 0;
            local_fe8.exp = 0;
            local_fe8.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::from_unsigned_long_long
                      (&local_fe8,1);
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      (&pnVar24[lVar1].m_backend,&local_fe8);
            pnVar24 = local_f58.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_fe8.fpclass = cpp_dec_float_finite;
            local_fe8.prec_elem = 0x1c;
            local_fe8.data._M_elems[0] = 0;
            local_fe8.data._M_elems[1] = 0;
            local_fe8.data._M_elems[2] = 0;
            local_fe8.data._M_elems[3] = 0;
            local_fe8.data._M_elems[4] = 0;
            local_fe8.data._M_elems[5] = 0;
            local_fe8.data._M_elems[6] = 0;
            local_fe8.data._M_elems[7] = 0;
            local_fe8.data._M_elems[8] = 0;
            local_fe8.data._M_elems[9] = 0;
            local_fe8.data._M_elems[10] = 0;
            local_fe8.data._M_elems[0xb] = 0;
            local_fe8.data._M_elems[0xc] = 0;
            local_fe8.data._M_elems[0xd] = 0;
            local_fe8.data._M_elems[0xe] = 0;
            local_fe8.data._M_elems[0xf] = 0;
            local_fe8.data._M_elems[0x10] = 0;
            local_fe8.data._M_elems[0x11] = 0;
            local_fe8.data._M_elems[0x12] = 0;
            local_fe8.data._M_elems[0x13] = 0;
            local_fe8.data._M_elems[0x14] = 0;
            local_fe8.data._M_elems[0x15] = 0;
            local_fe8.data._M_elems[0x16] = 0;
            local_fe8.data._M_elems[0x17] = 0;
            local_fe8.data._M_elems[0x18] = 0;
            local_fe8.data._M_elems[0x19] = 0;
            local_fe8.data._M_elems._104_5_ = 0;
            local_fe8.data._M_elems[0x1b]._1_3_ = 0;
            local_fe8.exp = 0;
            local_fe8.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::from_unsigned_long_long
                      (&local_fe8,1);
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      (&pnVar24[lVar1].m_backend,&local_fe8);
          }
          lVar13 = lVar13 + 1;
          lVar17 = lVar17 + 0x84;
        } while (lVar13 < (pIVar4->data).
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .memused);
      }
      pnVar24 = (lp->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).low.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar1;
      uVar16 = (pnVar24->m_backend).data._M_elems[0];
      puVar21 = (uint *)((long)&(pnVar24->m_backend).data + 4);
      puVar25 = local_7a4;
      for (lVar13 = 0x1b; lVar13 != 0; lVar13 = lVar13 + -1) {
        *puVar25 = *puVar21;
        puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
        puVar25 = puVar25 + (ulong)bVar29 * -2 + 1;
      }
      local_ff4 = (pnVar24->m_backend).exp;
      bVar28 = (pnVar24->m_backend).neg;
      fVar15 = (pnVar24->m_backend).fpclass;
      iVar27 = (pnVar24->m_backend).prec_elem;
      pnVar24 = (lp->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).up.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pnVar20 = pnVar24 + lVar1;
      pcVar11 = &local_f28;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        (pcVar11->data)._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
        pnVar20 = (pointer)((long)pnVar20 + ((ulong)bVar29 * -2 + 1) * 4);
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar29 * -8 + 4);
      }
      local_f28.exp = pnVar24[lVar1].m_backend.exp;
      local_f28.neg = pnVar24[lVar1].m_backend.neg;
      local_f28.fpclass = pnVar24[lVar1].m_backend.fpclass;
      local_f28.prec_elem = pnVar24[lVar1].m_backend.prec_elem;
      local_738.m_backend.data._M_elems[0] = uVar16;
      puVar21 = local_7a4;
      puVar25 = local_738.m_backend.data._M_elems + 1;
      for (lVar13 = 0x1b; lVar13 != 0; lVar13 = lVar13 + -1) {
        *puVar25 = *puVar21;
        puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
        puVar25 = puVar25 + (ulong)bVar29 * -2 + 1;
      }
      local_738.m_backend.exp = local_ff4;
      local_738.m_backend.neg = (bool)bVar28;
      local_738.m_backend.fpclass = fVar15;
      local_738.m_backend.prec_elem = iVar27;
      ::soplex::infinity::__tls_init();
      local_b28.m_backend.fpclass = cpp_dec_float_finite;
      local_b28.m_backend.prec_elem = 0x1c;
      local_b28.m_backend.data._M_elems[0] = 0;
      local_b28.m_backend.data._M_elems[1] = 0;
      local_b28.m_backend.data._M_elems[2] = 0;
      local_b28.m_backend.data._M_elems[3] = 0;
      local_b28.m_backend.data._M_elems[4] = 0;
      local_b28.m_backend.data._M_elems[5] = 0;
      local_b28.m_backend.data._M_elems[6] = 0;
      local_b28.m_backend.data._M_elems[7] = 0;
      local_b28.m_backend.data._M_elems[8] = 0;
      local_b28.m_backend.data._M_elems[9] = 0;
      local_b28.m_backend.data._M_elems[10] = 0;
      local_b28.m_backend.data._M_elems[0xb] = 0;
      local_b28.m_backend.data._M_elems[0xc] = 0;
      local_b28.m_backend.data._M_elems[0xd] = 0;
      local_b28.m_backend.data._M_elems[0xe] = 0;
      local_b28.m_backend.data._M_elems[0xf] = 0;
      local_b28.m_backend.data._M_elems[0x10] = 0;
      local_b28.m_backend.data._M_elems[0x11] = 0;
      local_b28.m_backend.data._M_elems[0x12] = 0;
      local_b28.m_backend.data._M_elems[0x13] = 0;
      local_b28.m_backend.data._M_elems[0x14] = 0;
      local_b28.m_backend.data._M_elems[0x15] = 0;
      local_b28.m_backend.data._M_elems[0x16] = 0;
      local_b28.m_backend.data._M_elems[0x17] = 0;
      local_b28.m_backend.data._M_elems[0x18] = 0;
      local_b28.m_backend.data._M_elems[0x19] = 0;
      local_b28.m_backend.data._M_elems._104_5_ = 0;
      local_b28.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      local_b28.m_backend.exp = 0;
      local_b28.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_b28,(double)CONCAT44(uStack_e24,local_e28));
      pTVar2 = (this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      p_Var3 = (this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
      }
      RVar6 = Tolerances::epsilon(pTVar2);
      bVar8 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                        (&local_738,&local_b28,RVar6);
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      if (bVar8) {
        pcVar11 = &local_d28;
        pcVar22 = &local_fe8;
        for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
          (pcVar22->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
          pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar29 * -8 + 4);
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar29 * -8 + 4);
        }
        local_fe8.exp = local_d28.exp;
        local_fe8.neg = local_d28.neg;
        local_fe8.fpclass = local_d28.fpclass;
        local_fe8.prec_elem = local_d28.prec_elem;
        if (local_fe8.data._M_elems[0] != 0 || local_d28.fpclass != cpp_dec_float_finite) {
          local_fe8.neg = (bool)(local_d28.neg ^ 1);
        }
        if (local_f28.fpclass == cpp_dec_float_NaN || local_d28.fpclass == cpp_dec_float_NaN) {
LAB_00562d1c:
          puVar21 = local_f28.data._M_elems + 1;
          pcVar11 = &local_da8;
          for (lVar13 = 0x1b; lVar13 != 0; lVar13 = lVar13 + -1) {
            (pcVar11->data)._M_elems[0] = *puVar21;
            puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
            pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar29 * -8 + 4);
          }
          local_ff4 = local_f28.exp;
          bVar28 = local_f28.neg;
          fVar15 = local_f28.fpclass;
          iVar27 = local_f28.prec_elem;
          uVar16 = local_f28.data._M_elems[0];
        }
        else {
          iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&local_fe8,&local_f28);
          if (-1 < iVar9) {
            goto LAB_00562d1c;
          }
          uVar16 = local_d28.data._M_elems[0];
          puVar21 = local_d28.data._M_elems + 1;
          pcVar11 = &local_da8;
          for (lVar13 = 0x1b; lVar13 != 0; lVar13 = lVar13 + -1) {
            (pcVar11->data)._M_elems[0] = *puVar21;
            puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
            pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar29 * -8 + 4);
          }
          local_ff4 = local_d28.exp;
          iVar27 = local_d28.prec_elem;
          if (local_d28.fpclass == cpp_dec_float_finite && uVar16 == 0) {
            bVar28 = local_d28.neg;
            fVar15 = cpp_dec_float_finite;
            uVar16 = 0;
          }
          else {
            bVar28 = local_d28.neg ^ 1;
            fVar15 = local_d28.fpclass;
          }
        }
        pcVar11 = &local_da8;
        puVar21 = local_7a4;
        for (lVar13 = 0x1b; lVar13 != 0; lVar13 = lVar13 + -1) {
          *puVar21 = (pcVar11->data)._M_elems[0];
          pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar29 * -8 + 4);
          puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
        }
      }
      pcVar11 = &local_f28;
      pnVar19 = &local_638;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        (pnVar19->m_backend).data._M_elems[0] = (pcVar11->data)._M_elems[0];
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar29 * -8 + 4);
        pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar19 + ((ulong)bVar29 * -2 + 1) * 4);
      }
      local_638.m_backend.exp = local_f28.exp;
      local_638.m_backend.neg = local_f28.neg;
      local_638.m_backend.fpclass = local_f28.fpclass;
      local_638.m_backend.prec_elem = local_f28.prec_elem;
      ::soplex::infinity::__tls_init();
      local_ba8.m_backend.fpclass = cpp_dec_float_finite;
      local_ba8.m_backend.prec_elem = 0x1c;
      local_ba8.m_backend.data._M_elems[0] = 0;
      local_ba8.m_backend.data._M_elems[1] = 0;
      local_ba8.m_backend.data._M_elems[2] = 0;
      local_ba8.m_backend.data._M_elems[3] = 0;
      local_ba8.m_backend.data._M_elems[4] = 0;
      local_ba8.m_backend.data._M_elems[5] = 0;
      local_ba8.m_backend.data._M_elems[6] = 0;
      local_ba8.m_backend.data._M_elems[7] = 0;
      local_ba8.m_backend.data._M_elems[8] = 0;
      local_ba8.m_backend.data._M_elems[9] = 0;
      local_ba8.m_backend.data._M_elems[10] = 0;
      local_ba8.m_backend.data._M_elems[0xb] = 0;
      local_ba8.m_backend.data._M_elems[0xc] = 0;
      local_ba8.m_backend.data._M_elems[0xd] = 0;
      local_ba8.m_backend.data._M_elems[0xe] = 0;
      local_ba8.m_backend.data._M_elems[0xf] = 0;
      local_ba8.m_backend.data._M_elems[0x10] = 0;
      local_ba8.m_backend.data._M_elems[0x11] = 0;
      local_ba8.m_backend.data._M_elems[0x12] = 0;
      local_ba8.m_backend.data._M_elems[0x13] = 0;
      local_ba8.m_backend.data._M_elems[0x14] = 0;
      local_ba8.m_backend.data._M_elems[0x15] = 0;
      local_ba8.m_backend.data._M_elems[0x16] = 0;
      local_ba8.m_backend.data._M_elems[0x17] = 0;
      local_ba8.m_backend.data._M_elems[0x18] = 0;
      local_ba8.m_backend.data._M_elems[0x19] = 0;
      local_ba8.m_backend.data._M_elems._104_5_ = 0;
      local_ba8.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      local_ba8.m_backend.exp = 0;
      local_ba8.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_ba8,local_e88);
      pTVar2 = (this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      p_Var3 = (this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
      }
      RVar6 = Tolerances::epsilon(pTVar2);
      bVar8 = GE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                        (&local_638,&local_ba8,RVar6);
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      if (bVar8) {
        pnVar24 = (lp->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).low.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pcVar11 = &local_d28;
        if ((pnVar24[lVar1].m_backend.fpclass != cpp_dec_float_NaN) &&
           (local_d28.fpclass != cpp_dec_float_NaN)) {
          iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&pnVar24[lVar1].m_backend,pcVar11);
          pcVar11 = &local_d28;
          if (0 < iVar9) {
            pcVar11 = &(lp->
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).low.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend;
          }
        }
        pcVar22 = pcVar11;
        pcVar23 = &local_f28;
        for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
          (pcVar23->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar29 * -8 + 4);
          pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar29 * -8 + 4);
        }
        local_f28.exp = pcVar11->exp;
        local_f28.neg = pcVar11->neg;
        local_f28.fpclass = pcVar11->fpclass;
        local_f28.prec_elem = pcVar11->prec_elem;
      }
      if (bVar7) {
        local_c28.fpclass = cpp_dec_float_finite;
        local_c28.prec_elem = 0x1c;
        local_c28.data._M_elems[0] = 0;
        local_c28.data._M_elems[1] = 0;
        local_c28.data._M_elems[2] = 0;
        local_c28.data._M_elems[3] = 0;
        local_c28.data._M_elems[4] = 0;
        local_c28.data._M_elems[5] = 0;
        local_c28.data._M_elems[6] = 0;
        local_c28.data._M_elems[7] = 0;
        local_c28.data._M_elems[8] = 0;
        local_c28.data._M_elems[9] = 0;
        local_c28.data._M_elems[10] = 0;
        local_c28.data._M_elems[0xb] = 0;
        local_c28.data._M_elems[0xc] = 0;
        local_c28.data._M_elems[0xd] = 0;
        local_c28.data._M_elems[0xe] = 0;
        local_c28.data._M_elems[0xf] = 0;
        local_c28.data._M_elems[0x10] = 0;
        local_c28.data._M_elems[0x11] = 0;
        local_c28.data._M_elems[0x12] = 0;
        local_c28.data._M_elems[0x13] = 0;
        local_c28.data._M_elems[0x14] = 0;
        local_c28.data._M_elems[0x15] = 0;
        local_c28.data._M_elems[0x16] = 0;
        local_c28.data._M_elems[0x17] = 0;
        local_c28.data._M_elems[0x18] = 0;
        local_c28.data._M_elems[0x19] = 0;
        local_c28.data._M_elems._104_5_ = 0;
        local_c28.data._M_elems[0x1b]._1_3_ = 0;
        local_c28.exp = 0;
        local_c28.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_c28,0.0);
        feastol((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_1b8,this);
        local_fe8.data._M_elems[0] = uVar16;
        puVar21 = local_7a4;
        puVar25 = local_fe8.data._M_elems + 1;
        for (lVar13 = 0x1b; lVar13 != 0; lVar13 = lVar13 + -1) {
          *puVar25 = *puVar21;
          puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
          puVar25 = puVar25 + (ulong)bVar29 * -2 + 1;
        }
        local_fe8.exp = local_ff4;
        local_fe8.prec_elem = iVar27;
        local_fe8.fpclass = fVar15;
        local_fe8.neg = (bool)bVar28;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  (&local_fe8,&local_c28);
        if (((local_fe8.fpclass != cpp_dec_float_NaN) && (local_1b8.fpclass != cpp_dec_float_NaN))
           && (iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (&local_fe8,&local_1b8), iVar9 < 0)) {
          pcVar11 = &local_f28;
          pnVar19 = &local_6b8;
          for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
            (pnVar19->m_backend).data._M_elems[0] = (pcVar11->data)._M_elems[0];
            pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar29 * -8 + 4);
            pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar19 + ((ulong)bVar29 * -2 + 1) * 4);
          }
          local_6b8.m_backend.exp = local_f28.exp;
          local_6b8.m_backend.neg = local_f28.neg;
          local_6b8.m_backend.fpclass = local_f28.fpclass;
          local_6b8.m_backend.prec_elem = local_f28.prec_elem;
          local_ca8.m_backend.fpclass = cpp_dec_float_finite;
          local_ca8.m_backend.prec_elem = 0x1c;
          local_ca8.m_backend.data._M_elems[0] = 0;
          local_ca8.m_backend.data._M_elems[1] = 0;
          local_ca8.m_backend.data._M_elems[2] = 0;
          local_ca8.m_backend.data._M_elems[3] = 0;
          local_ca8.m_backend.data._M_elems[4] = 0;
          local_ca8.m_backend.data._M_elems[5] = 0;
          local_ca8.m_backend.data._M_elems[6] = 0;
          local_ca8.m_backend.data._M_elems[7] = 0;
          local_ca8.m_backend.data._M_elems[8] = 0;
          local_ca8.m_backend.data._M_elems[9] = 0;
          local_ca8.m_backend.data._M_elems[10] = 0;
          local_ca8.m_backend.data._M_elems[0xb] = 0;
          local_ca8.m_backend.data._M_elems[0xc] = 0;
          local_ca8.m_backend.data._M_elems[0xd] = 0;
          local_ca8.m_backend.data._M_elems[0xe] = 0;
          local_ca8.m_backend.data._M_elems[0xf] = 0;
          local_ca8.m_backend.data._M_elems[0x10] = 0;
          local_ca8.m_backend.data._M_elems[0x11] = 0;
          local_ca8.m_backend.data._M_elems[0x12] = 0;
          local_ca8.m_backend.data._M_elems[0x13] = 0;
          local_ca8.m_backend.data._M_elems[0x14] = 0;
          local_ca8.m_backend.data._M_elems[0x15] = 0;
          local_ca8.m_backend.data._M_elems[0x16] = 0;
          local_ca8.m_backend.data._M_elems[0x17] = 0;
          local_ca8.m_backend.data._M_elems[0x18] = 0;
          local_ca8.m_backend.data._M_elems[0x19] = 0;
          local_ca8.m_backend.data._M_elems._104_5_ = 0;
          local_ca8.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          local_ca8.m_backend.exp = 0;
          local_ca8.m_backend.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_ca8,0.0);
          feastol(&local_b0,this);
          bVar8 = GE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_6b8,&local_ca8,&local_b0);
          if (bVar8) {
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)
                       (local_e40.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar1),0.0);
            goto LAB_00563118;
          }
        }
        bVar7 = false;
      }
LAB_00563118:
      pnVar24 = local_e58.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar1;
      (pnVar24->m_backend).data._M_elems[0] = uVar16;
      puVar21 = local_7a4;
      puVar25 = (pnVar24->m_backend).data._M_elems + 1;
      for (lVar13 = 0x1b; lVar13 != 0; lVar13 = lVar13 + -1) {
        *puVar25 = *puVar21;
        puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
        puVar25 = puVar25 + (ulong)bVar29 * -2 + 1;
      }
      (pnVar24->m_backend).exp = local_ff4;
      (pnVar24->m_backend).neg = (bool)bVar28;
      (pnVar24->m_backend).fpclass = fVar15;
      (pnVar24->m_backend).prec_elem = iVar27;
      pcVar11 = &local_f28;
      pnVar24 = local_e70.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar1;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        (pnVar24->m_backend).data._M_elems[0] = (pcVar11->data)._M_elems[0];
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + ((ulong)bVar29 * -2 + 1) * 4);
        pnVar24 = (pointer)((long)pnVar24 + ((ulong)bVar29 * -2 + 1) * 4);
      }
      local_e70.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.exp = local_f28.exp;
      local_e70.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.neg = local_f28.neg;
      local_e70.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.fpclass = local_f28.fpclass;
      local_e70.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.prec_elem = local_f28.prec_elem;
      fVar12 = local_f58.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.fpclass;
      fVar10 = local_f40.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.fpclass;
      if ((fVar12 == cpp_dec_float_NaN) || (fVar10 == cpp_dec_float_NaN)) {
LAB_00563232:
        if (((fVar12 == cpp_dec_float_NaN) || (fVar10 == cpp_dec_float_NaN)) ||
           (iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&local_f58.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend,
                               &local_f40.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend),
           -1 < iVar9)) {
          local_824.data._M_elems[0] = uVar16;
          puVar21 = local_7a4;
          puVar25 = local_824.data._M_elems + 1;
          for (lVar13 = 0x1b; lVar13 != 0; lVar13 = lVar13 + -1) {
            *puVar25 = *puVar21;
            puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
            puVar25 = puVar25 + (ulong)bVar29 * -2 + 1;
          }
          local_824.exp = local_ff4;
          local_824.neg = (bool)bVar28;
          local_824.fpclass = fVar15;
          local_824.prec_elem = iVar27;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    (&local_824,&local_f28);
          local_da8.fpclass = cpp_dec_float_finite;
          local_da8.prec_elem = 0x1c;
          local_da8.data._M_elems[0] = 0;
          local_da8.data._M_elems[1] = 0;
          local_da8.data._M_elems[2] = 0;
          local_da8.data._M_elems[3] = 0;
          local_da8.data._M_elems[4] = 0;
          local_da8.data._M_elems[5] = 0;
          local_da8.data._M_elems[6] = 0;
          local_da8.data._M_elems[7] = 0;
          local_da8.data._M_elems[8] = 0;
          local_da8.data._M_elems[9] = 0;
          local_da8.data._M_elems[10] = 0;
          local_da8.data._M_elems[0xb] = 0;
          local_da8.data._M_elems[0xc] = 0;
          local_da8.data._M_elems[0xd] = 0;
          local_da8.data._M_elems[0xe] = 0;
          local_da8.data._M_elems[0xf] = 0;
          local_da8.data._M_elems[0x10] = 0;
          local_da8.data._M_elems[0x11] = 0;
          local_da8.data._M_elems[0x12] = 0;
          local_da8.data._M_elems[0x13] = 0;
          local_da8.data._M_elems[0x14] = 0;
          local_da8.data._M_elems[0x15] = 0;
          local_da8.data._M_elems[0x16] = 0;
          local_da8.data._M_elems[0x17] = 0;
          local_da8.data._M_elems[0x18] = 0;
          local_da8.data._M_elems[0x19] = 0;
          local_da8.data._M_elems._104_5_ = 0;
          local_da8.data._M_elems[0x1b]._1_3_ = 0;
          local_da8.exp = 0;
          local_da8.neg = false;
          local_fe8.fpclass = cpp_dec_float_finite;
          local_fe8.prec_elem = 0x1c;
          local_fe8.data._M_elems[0] = 0;
          local_fe8.data._M_elems[1] = 0;
          local_fe8.data._M_elems[2] = 0;
          local_fe8.data._M_elems[3] = 0;
          local_fe8.data._M_elems[4] = 0;
          local_fe8.data._M_elems[5] = 0;
          local_fe8.data._M_elems[6] = 0;
          local_fe8.data._M_elems[7] = 0;
          local_fe8.data._M_elems[8] = 0;
          local_fe8.data._M_elems[9] = 0;
          local_fe8.data._M_elems[10] = 0;
          local_fe8.data._M_elems[0xb] = 0;
          local_fe8.data._M_elems[0xc] = 0;
          local_fe8.data._M_elems[0xd] = 0;
          local_fe8.data._M_elems[0xe] = 0;
          local_fe8.data._M_elems[0xf] = 0;
          local_fe8.data._M_elems[0x10] = 0;
          local_fe8.data._M_elems[0x11] = 0;
          local_fe8.data._M_elems[0x12] = 0;
          local_fe8.data._M_elems[0x13] = 0;
          local_fe8.data._M_elems[0x14] = 0;
          local_fe8.data._M_elems[0x15] = 0;
          local_fe8.data._M_elems[0x16] = 0;
          local_fe8.data._M_elems[0x17] = 0;
          local_fe8.data._M_elems[0x18] = 0;
          local_fe8.data._M_elems[0x19] = 0;
          local_fe8.data._M_elems._104_5_ = 0;
          local_fe8.data._M_elems[0x1b]._1_3_ = 0;
          local_fe8.exp = 0;
          local_fe8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_fe8,2.0);
          lVar17 = local_f60;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&local_da8,&local_824,&local_fe8);
          pcVar11 = &local_da8;
          pnVar24 = local_ea0.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar1;
          for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
            (pnVar24->m_backend).data._M_elems[0] = (pcVar11->data)._M_elems[0];
            pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar29 * -8 + 4);
            pnVar24 = (pointer)((long)pnVar24 + ((ulong)bVar29 * -2 + 1) * 4);
          }
          local_ea0.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.exp = local_da8.exp;
          local_ea0.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.neg = local_da8.neg;
          local_ea0.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.fpclass = local_da8.fpclass;
          local_ea0.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.prec_elem = local_da8.prec_elem
          ;
        }
        else {
          pnVar24 = local_ea0.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar1;
          (pnVar24->m_backend).data._M_elems[0] = uVar16;
          puVar21 = local_7a4;
          puVar25 = (pnVar24->m_backend).data._M_elems + 1;
          for (lVar13 = 0x1b; lVar13 != 0; lVar13 = lVar13 + -1) {
            *puVar25 = *puVar21;
            puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
            puVar25 = puVar25 + (ulong)bVar29 * -2 + 1;
          }
          (pnVar24->m_backend).exp = local_ff4;
          (pnVar24->m_backend).neg = (bool)bVar28;
          (pnVar24->m_backend).fpclass = fVar15;
          (pnVar24->m_backend).prec_elem = iVar27;
          lVar17 = local_f60;
        }
      }
      else {
        iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&local_f58.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend,
                           &local_f40.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend);
        if (iVar9 < 1) {
          fVar12 = local_f58.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.fpclass;
          fVar10 = local_f40.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.fpclass;
          goto LAB_00563232;
        }
        pcVar11 = &local_f28;
        pnVar24 = local_ea0.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar1;
        for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
          (pnVar24->m_backend).data._M_elems[0] = (pcVar11->data)._M_elems[0];
          pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + ((ulong)bVar29 * -2 + 1) * 4)
          ;
          pnVar24 = (pointer)((long)pnVar24 + ((ulong)bVar29 * -2 + 1) * 4);
        }
        local_ea0.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.exp = local_f28.exp;
        local_ea0.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.neg = local_f28.neg;
        local_ea0.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.fpclass = local_f28.fpclass;
        local_ea0.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.prec_elem = local_f28.prec_elem;
        lVar17 = local_f60;
      }
      pcVar23 = &(lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).object.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend;
      pcVar22 = &local_e58.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend;
      local_fe8.fpclass = cpp_dec_float_finite;
      local_fe8.prec_elem = 0x1c;
      local_fe8.data._M_elems[0] = 0;
      local_fe8.data._M_elems[1] = 0;
      local_fe8.data._M_elems[2] = 0;
      local_fe8.data._M_elems[3] = 0;
      local_fe8.data._M_elems[4] = 0;
      local_fe8.data._M_elems[5] = 0;
      local_fe8.data._M_elems[6] = 0;
      local_fe8.data._M_elems[7] = 0;
      local_fe8.data._M_elems[8] = 0;
      local_fe8.data._M_elems[9] = 0;
      local_fe8.data._M_elems[10] = 0;
      local_fe8.data._M_elems[0xb] = 0;
      local_fe8.data._M_elems[0xc] = 0;
      local_fe8.data._M_elems[0xd] = 0;
      local_fe8.data._M_elems[0xe] = 0;
      local_fe8.data._M_elems[0xf] = 0;
      local_fe8.data._M_elems[0x10] = 0;
      local_fe8.data._M_elems[0x11] = 0;
      local_fe8.data._M_elems[0x12] = 0;
      local_fe8.data._M_elems[0x13] = 0;
      local_fe8.data._M_elems[0x14] = 0;
      local_fe8.data._M_elems[0x15] = 0;
      local_fe8.data._M_elems[0x16] = 0;
      local_fe8.data._M_elems[0x17] = 0;
      local_fe8.data._M_elems[0x18] = 0;
      local_fe8.data._M_elems[0x19] = 0;
      local_fe8.data._M_elems._104_5_ = 0;
      local_fe8.data._M_elems[0x1b]._1_3_ = 0;
      local_fe8.exp = 0;
      local_fe8.neg = false;
      pcVar11 = pcVar23;
      if ((&local_fe8 != pcVar22) && (pcVar11 = pcVar22, &local_fe8 != pcVar23)) {
        pcVar22 = pcVar23;
        pcVar26 = &local_fe8;
        for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
          (pcVar26->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar29 * -8 + 4);
          pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar29 * -8 + 4);
        }
        local_fe8.exp = pcVar23->exp;
        local_fe8.neg = pcVar23->neg;
        local_fe8.fpclass = pcVar23->fpclass;
        local_fe8.prec_elem = pcVar23->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&local_fe8,pcVar11);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                (&local_2b8,&local_fe8);
      pcVar23 = &(lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).object.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend;
      pcVar22 = &local_e70.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend;
      local_fe8.fpclass = cpp_dec_float_finite;
      local_fe8.prec_elem = 0x1c;
      local_fe8.data._M_elems[0] = 0;
      local_fe8.data._M_elems[1] = 0;
      local_fe8.data._M_elems[2] = 0;
      local_fe8.data._M_elems[3] = 0;
      local_fe8.data._M_elems[4] = 0;
      local_fe8.data._M_elems[5] = 0;
      local_fe8.data._M_elems[6] = 0;
      local_fe8.data._M_elems[7] = 0;
      local_fe8.data._M_elems[8] = 0;
      local_fe8.data._M_elems[9] = 0;
      local_fe8.data._M_elems[10] = 0;
      local_fe8.data._M_elems[0xb] = 0;
      local_fe8.data._M_elems[0xc] = 0;
      local_fe8.data._M_elems[0xd] = 0;
      local_fe8.data._M_elems[0xe] = 0;
      local_fe8.data._M_elems[0xf] = 0;
      local_fe8.data._M_elems[0x10] = 0;
      local_fe8.data._M_elems[0x11] = 0;
      local_fe8.data._M_elems[0x12] = 0;
      local_fe8.data._M_elems[0x13] = 0;
      local_fe8.data._M_elems[0x14] = 0;
      local_fe8.data._M_elems[0x15] = 0;
      local_fe8.data._M_elems[0x16] = 0;
      local_fe8.data._M_elems[0x17] = 0;
      local_fe8.data._M_elems[0x18] = 0;
      local_fe8.data._M_elems[0x19] = 0;
      local_fe8.data._M_elems._104_5_ = 0;
      local_fe8.data._M_elems[0x1b]._1_3_ = 0;
      local_fe8.exp = 0;
      local_fe8.neg = false;
      pcVar11 = pcVar23;
      if ((&local_fe8 != pcVar22) && (pcVar11 = pcVar22, &local_fe8 != pcVar23)) {
        pcVar22 = pcVar23;
        pcVar26 = &local_fe8;
        for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
          (pcVar26->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar29 * -8 + 4);
          pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar29 * -8 + 4);
        }
        local_fe8.exp = pcVar23->exp;
        local_fe8.neg = pcVar23->neg;
        local_fe8.fpclass = pcVar23->fpclass;
        local_fe8.prec_elem = pcVar23->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&local_fe8,pcVar11);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                (&local_338,&local_fe8);
      pcVar22 = &(lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).object.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend;
      pcVar23 = &local_ea0.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend;
      local_fe8.fpclass = cpp_dec_float_finite;
      local_fe8.prec_elem = 0x1c;
      local_fe8.data._M_elems[0] = 0;
      local_fe8.data._M_elems[1] = 0;
      local_fe8.data._M_elems[2] = 0;
      local_fe8.data._M_elems[3] = 0;
      local_fe8.data._M_elems[4] = 0;
      local_fe8.data._M_elems[5] = 0;
      local_fe8.data._M_elems[6] = 0;
      local_fe8.data._M_elems[7] = 0;
      local_fe8.data._M_elems[8] = 0;
      local_fe8.data._M_elems[9] = 0;
      local_fe8.data._M_elems[10] = 0;
      local_fe8.data._M_elems[0xb] = 0;
      local_fe8.data._M_elems[0xc] = 0;
      local_fe8.data._M_elems[0xd] = 0;
      local_fe8.data._M_elems[0xe] = 0;
      local_fe8.data._M_elems[0xf] = 0;
      local_fe8.data._M_elems[0x10] = 0;
      local_fe8.data._M_elems[0x11] = 0;
      local_fe8.data._M_elems[0x12] = 0;
      local_fe8.data._M_elems[0x13] = 0;
      local_fe8.data._M_elems[0x14] = 0;
      local_fe8.data._M_elems[0x15] = 0;
      local_fe8.data._M_elems[0x16] = 0;
      local_fe8.data._M_elems[0x17] = 0;
      local_fe8.data._M_elems[0x18] = 0;
      local_fe8.data._M_elems[0x19] = 0;
      local_fe8.data._M_elems._104_5_ = 0;
      local_fe8.data._M_elems[0x1b]._1_3_ = 0;
      local_fe8.exp = 0;
      local_fe8.neg = false;
      pcVar11 = pcVar22;
      if ((&local_fe8 != pcVar23) && (pcVar11 = pcVar23, &local_fe8 != pcVar22)) {
        pcVar23 = pcVar22;
        pcVar26 = &local_fe8;
        for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
          (pcVar26->data)._M_elems[0] = (pcVar23->data)._M_elems[0];
          pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar29 * -8 + 4);
          pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar29 * -8 + 4);
        }
        local_fe8.exp = pcVar22->exp;
        local_fe8.neg = pcVar22->neg;
        local_fe8.fpclass = pcVar22->fpclass;
        local_fe8.prec_elem = pcVar22->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&local_fe8,pcVar11);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                (&local_3b8,&local_fe8);
      lVar13 = local_e10;
    } while (1 < lVar17);
  }
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::vector(&local_dc0,&local_e58);
  bVar8 = checkSolution(this,lp,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)&local_dc0);
  if (local_dc0.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_dc0.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_dc0.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_dc0.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (((bVar8) && (local_2b8.fpclass != cpp_dec_float_NaN)) &&
     ((this->m_cutoffbound).m_backend.fpclass != cpp_dec_float_NaN)) {
    iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                      (&local_2b8,&(this->m_cutoffbound).m_backend);
    if (0 < iVar9) {
      pcVar11 = &local_2b8;
      pnVar19 = &this->m_cutoffbound;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        (pnVar19->m_backend).data._M_elems[0] = (pcVar11->data)._M_elems[0];
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + ((ulong)bVar29 * -2 + 1) * 4);
        pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar19 + (ulong)bVar29 * -8 + 4);
      }
      (this->m_cutoffbound).m_backend.exp = local_2b8.exp;
      (this->m_cutoffbound).m_backend.neg = local_2b8.neg;
      (this->m_cutoffbound).m_backend.fpclass = local_2b8.fpclass;
      (this->m_cutoffbound).m_backend.prec_elem = local_2b8.prec_elem;
    }
  }
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::vector(&local_dd8,&local_e70);
  bVar8 = checkSolution(this,lp,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)&local_dd8);
  if (local_dd8.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_dd8.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_dd8.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_dd8.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (((bVar8) && (local_338.fpclass != cpp_dec_float_NaN)) &&
     ((this->m_cutoffbound).m_backend.fpclass != cpp_dec_float_NaN)) {
    iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                      (&local_338,&(this->m_cutoffbound).m_backend);
    if (0 < iVar9) {
      pcVar11 = &local_338;
      pnVar19 = &this->m_cutoffbound;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        (pnVar19->m_backend).data._M_elems[0] = (pcVar11->data)._M_elems[0];
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + ((ulong)bVar29 * -2 + 1) * 4);
        pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar19 + (ulong)bVar29 * -8 + 4);
      }
      (this->m_cutoffbound).m_backend.exp = local_338.exp;
      (this->m_cutoffbound).m_backend.neg = local_338.neg;
      (this->m_cutoffbound).m_backend.fpclass = local_338.fpclass;
      (this->m_cutoffbound).m_backend.prec_elem = local_338.prec_elem;
    }
  }
  if (bVar7) {
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ::vector(&local_df0,&local_e40);
    bVar7 = checkSolution(this,lp,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)&local_df0);
    if (local_df0.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_df0.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_df0.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_df0.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (((bVar7) && (local_238.fpclass != cpp_dec_float_NaN)) &&
       ((this->m_cutoffbound).m_backend.fpclass != cpp_dec_float_NaN)) {
      iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                        (&local_238,&(this->m_cutoffbound).m_backend);
      if (0 < iVar9) {
        pcVar11 = &local_238;
        pnVar19 = &this->m_cutoffbound;
        for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
          (pnVar19->m_backend).data._M_elems[0] = (pcVar11->data)._M_elems[0];
          pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + ((ulong)bVar29 * -2 + 1) * 4)
          ;
          pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar19 + (ulong)bVar29 * -8 + 4);
        }
        (this->m_cutoffbound).m_backend.exp = local_238.exp;
        (this->m_cutoffbound).m_backend.neg = local_238.neg;
        (this->m_cutoffbound).m_backend.fpclass = local_238.fpclass;
        (this->m_cutoffbound).m_backend.prec_elem = local_238.prec_elem;
      }
    }
  }
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::vector(&local_e08,&local_ea0);
  bVar7 = checkSolution(this,lp,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)&local_e08);
  if (local_e08.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e08.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e08.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e08.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (((bVar7) && (local_3b8.fpclass != cpp_dec_float_NaN)) &&
     ((this->m_cutoffbound).m_backend.fpclass != cpp_dec_float_NaN)) {
    iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                      (&local_3b8,&(this->m_cutoffbound).m_backend);
    if (0 < iVar9) {
      pcVar11 = &local_3b8;
      pnVar19 = &this->m_cutoffbound;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        (pnVar19->m_backend).data._M_elems[0] = (pcVar11->data)._M_elems[0];
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + ((ulong)bVar29 * -2 + 1) * 4);
        pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar19 + (ulong)bVar29 * -8 + 4);
      }
      (this->m_cutoffbound).m_backend.exp = local_3b8.exp;
      (this->m_cutoffbound).m_backend.neg = local_3b8.neg;
      (this->m_cutoffbound).m_backend.fpclass = local_3b8.fpclass;
      (this->m_cutoffbound).m_backend.prec_elem = local_3b8.prec_elem;
    }
  }
  if (local_f58.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f58.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f58.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f58.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f40.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f40.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f40.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f40.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_ea0.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_ea0.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_ea0.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_ea0.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e70.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e70.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e70.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e70.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e58.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e58.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e58.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e58.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e40.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e40.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e40.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e40.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SPxMainSM<R>::trivialHeuristic(SPxLPBase<R>& lp)
{
   VectorBase<R>         zerosol(lp.nCols());  // the zero solution VectorBase<R>
   VectorBase<R>         lowersol(lp.nCols()); // the lower bound solution VectorBase<R>
   VectorBase<R>         uppersol(lp.nCols()); // the upper bound solution VectorBase<R>
   VectorBase<R>         locksol(lp.nCols());  // the locks solution VectorBase<R>

   VectorBase<R>         upLocks(lp.nCols());
   VectorBase<R>         downLocks(lp.nCols());

   R            zeroObj = this->m_objoffset;
   R            lowerObj = this->m_objoffset;
   R            upperObj = this->m_objoffset;
   R            lockObj = this->m_objoffset;

   bool            zerovalid = true;

   R largeValue = R(infinity);

   if(LT(R(1.0 / feastol()), R(infinity), this->tolerances()->epsilon()))
      largeValue = 1.0 / feastol();



   for(int j = lp.nCols() - 1; j >= 0; --j)
   {
      upLocks[j] = 0;
      downLocks[j] = 0;

      // computing the locks on the variables
      const SVectorBase<R>& col = lp.colVector(j);

      for(int k = 0; k < col.size(); ++k)
      {
         R aij = col.value(k);

         SOPLEX_ASSERT_WARN("WMAISM45", isNotZero(aij, R(1.0 / R(infinity))));

         if(GT(lp.lhs(col.index(k)), R(-infinity), this->tolerances()->epsilon())
               && LT(lp.rhs(col.index(k)), R(infinity), this->tolerances()->epsilon()))
         {
            upLocks[j]++;
            downLocks[j]++;
         }
         else if(GT(lp.lhs(col.index(k)), R(-infinity), this->tolerances()->epsilon()))
         {
            if(aij > 0)
               downLocks[j]++;
            else if(aij < 0)
               upLocks[j]++;
         }
         else if(LT(lp.rhs(col.index(k)), R(infinity), this->tolerances()->epsilon()))
         {
            if(aij > 0)
               upLocks[j]++;
            else if(aij < 0)
               downLocks[j]++;
         }
      }

      R lower = lp.lower(j);
      R upper = lp.upper(j);

      if(LE(lower, R(-infinity), this->tolerances()->epsilon()))
         lower = SOPLEX_MIN(-largeValue, upper);

      if(GE(upper, R(infinity), this->tolerances()->epsilon()))
         upper = SOPLEX_MAX(lp.lower(j), largeValue);

      if(zerovalid)
      {
         if(LE(lower, R(0.0), feastol()) && GE(upper, R(0.0), feastol()))
            zerosol[j] = 0.0;
         else
            zerovalid = false;
      }

      lowersol[j] = lower;
      uppersol[j] = upper;

      if(downLocks[j] > upLocks[j])
         locksol[j] = upper;
      else if(downLocks[j] < upLocks[j])
         locksol[j] = lower;
      else
         locksol[j] = (lower + upper) / 2.0;

      lowerObj += lp.maxObj(j) * lowersol[j];
      upperObj += lp.maxObj(j) * uppersol[j];
      lockObj += lp.maxObj(j) * locksol[j];
   }

   // trying the lower bound solution
   if(checkSolution(lp, lowersol))
   {
      if(lowerObj > m_cutoffbound)
         m_cutoffbound = lowerObj;
   }

   // trying the upper bound solution
   if(checkSolution(lp, uppersol))
   {
      if(upperObj > m_cutoffbound)
         m_cutoffbound = upperObj;
   }

   // trying the zero solution
   if(zerovalid && checkSolution(lp, zerosol))
   {
      if(zeroObj > m_cutoffbound)
         m_cutoffbound = zeroObj;
   }

   // trying the lock solution
   if(checkSolution(lp, locksol))
   {
      if(lockObj > m_cutoffbound)
         m_cutoffbound = lockObj;
   }
}